

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndn-lite-hmac.c
# Opt level: O3

int ndn_hmac_make_key(ndn_hmac_key_t *hmac_key,uint32_t key_id,uint8_t *input_value,
                     uint32_t input_size,uint8_t *personalization,uint32_t personalization_size,
                     uint8_t *seed_value,uint32_t seed_size,uint8_t *additional_value,
                     uint32_t additional_size,uint32_t salt_size)

{
  long lVar1;
  undefined4 input_size_00;
  int iVar2;
  int iVar3;
  undefined8 auStack_70 [2];
  ulong uStack_60;
  uint8_t auStack_58 [8];
  uint8_t key_bytes [32];
  
  key_bytes._28_4_ = input_size;
  hmac_key->key_id = key_id;
  lVar1 = -((ulong)salt_size + 0xf & 0xfffffffffffffff0);
  *(ulong *)((long)&uStack_60 + lVar1) = (ulong)additional_size;
  *(uint8_t **)((long)auStack_70 + lVar1 + 8) = additional_value;
  *(undefined8 *)((long)auStack_70 + lVar1) = 0x1151b1;
  iVar2 = (*ndn_hmac_backend.hmacprng)
                    (personalization,personalization_size,key_bytes + lVar1 + -8,salt_size,
                     seed_value,seed_size,*(uint8_t **)((long)auStack_70 + lVar1 + 8),
                     *(uint32_t *)((long)&uStack_60 + lVar1));
  input_size_00 = key_bytes._28_4_;
  iVar3 = -0x19;
  if (iVar2 == 0) {
    key_bytes[8] = '\0';
    key_bytes[9] = '\0';
    key_bytes[10] = '\0';
    key_bytes[0xb] = '\0';
    key_bytes[0xc] = '\0';
    key_bytes[0xd] = '\0';
    key_bytes[0xe] = '\0';
    key_bytes[0xf] = '\0';
    key_bytes[0x10] = '\0';
    key_bytes[0x11] = '\0';
    key_bytes[0x12] = '\0';
    key_bytes[0x13] = '\0';
    key_bytes[0x14] = '\0';
    key_bytes[0x15] = '\0';
    key_bytes[0x16] = '\0';
    key_bytes[0x17] = '\0';
    auStack_58[0] = '\0';
    auStack_58[1] = '\0';
    auStack_58[2] = '\0';
    auStack_58[3] = '\0';
    auStack_58[4] = '\0';
    auStack_58[5] = '\0';
    auStack_58[6] = '\0';
    auStack_58[7] = '\0';
    key_bytes[0] = '\0';
    key_bytes[1] = '\0';
    key_bytes[2] = '\0';
    key_bytes[3] = '\0';
    key_bytes[4] = '\0';
    key_bytes[5] = '\0';
    key_bytes[6] = '\0';
    key_bytes[7] = '\0';
    *(undefined8 *)((long)&uStack_60 + lVar1) = 0;
    *(undefined8 *)((long)auStack_70 + lVar1 + 8) = 0;
    *(undefined8 *)((long)auStack_70 + lVar1) = 0x1151e8;
    iVar2 = ndn_hkdf(input_value,input_size_00,auStack_58,0x20,key_bytes + lVar1 + -8,salt_size,
                     *(uint8_t **)((long)auStack_70 + lVar1 + 8),
                     *(uint32_t *)((long)&uStack_60 + lVar1));
    iVar3 = -0x19;
    if (iVar2 == 0) {
      *(undefined8 *)((long)&uStack_60 + lVar1) = 0x115209;
      (*ndn_hmac_backend.load_key)(&hmac_key->abs_key,auStack_58,0x20);
      iVar3 = 0;
    }
  }
  return iVar3;
}

Assistant:

int
ndn_hmac_make_key(ndn_hmac_key_t* hmac_key, uint32_t key_id,
                  const uint8_t* input_value, uint32_t input_size,
                  const uint8_t* personalization, uint32_t personalization_size,
                  const uint8_t* seed_value, uint32_t seed_size,
                  const uint8_t* additional_value, uint32_t additional_size,
                  uint32_t salt_size)
{
  hmac_key->key_id = key_id;
  uint8_t salt[salt_size];
  int r = ndn_hmacprng(personalization, personalization_size,
                       salt, sizeof(salt), seed_value, seed_size,
                       additional_value, additional_size);

  if (r != NDN_SUCCESS)
    return NDN_SEC_CRYPTO_ALGO_FAILURE;

  uint8_t key_bytes[NDN_SEC_SHA256_HASH_SIZE] = {0};
  r = ndn_hkdf(input_value, input_size, key_bytes, NDN_SEC_SHA256_HASH_SIZE,
               salt, sizeof(salt), NULL, 0);
  if (r != NDN_SUCCESS)
    return NDN_SEC_CRYPTO_ALGO_FAILURE;
  ndn_hmac_load_key(hmac_key, key_bytes, NDN_SEC_SHA256_HASH_SIZE);
  return NDN_SUCCESS;
}